

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_andnot.c
# Opt level: O2

_Bool bitset_run_container_andnot
                (bitset_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  int iVar2;
  bitset_container_t *dest;
  array_container_t *paVar3;
  int32_t rlepos;
  long lVar4;
  
  dest = bitset_container_create();
  bitset_container_copy(src_1,dest);
  for (lVar4 = 0; lVar4 < src_2->n_runs; lVar4 = lVar4 + 1) {
    uVar1 = src_2->runs[lVar4].value;
    bitset_reset_range(dest->words,(uint)uVar1,(uint)uVar1 + (uint)src_2->runs[lVar4].length + 1);
  }
  iVar2 = bitset_container_compute_cardinality(dest);
  dest->cardinality = iVar2;
  if (iVar2 < 0x1001) {
    paVar3 = array_container_from_bitset(dest);
    *dst = paVar3;
    bitset_container_free(dest);
  }
  else {
    *dst = dest;
  }
  return 0x1000 < iVar2;
}

Assistant:

bool bitset_run_container_andnot(const bitset_container_t *src_1,
                                 const run_container_t *src_2,
                                 container_t **dst) {
    // follows Java implementation
    bitset_container_t *result = bitset_container_create();

    bitset_container_copy(src_1, result);
    for (int32_t rlepos = 0; rlepos < src_2->n_runs; ++rlepos) {
        rle16_t rle = src_2->runs[rlepos];
        bitset_reset_range(result->words, rle.value,
                           rle.value + rle.length + UINT32_C(1));
    }
    result->cardinality = bitset_container_compute_cardinality(result);

    if (result->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(result);
        bitset_container_free(result);
        return false;  // not bitset
    }
    *dst = result;
    return true;  // bitset
}